

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ppmd7Dec.c
# Opt level: O2

Bool_conflict Ppmd7z_RangeDec_Init(CPpmd7z_RangeDec *p)

{
  UInt32 UVar1;
  Byte BVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  
  p->Range = 0xffffffff;
  p->Code = 0;
  BVar2 = (*p->Stream->Read)(p->Stream);
  uVar4 = 0;
  if (BVar2 == '\0') {
    iVar5 = 4;
    while( true ) {
      UVar1 = p->Code;
      bVar6 = iVar5 == 0;
      iVar5 = iVar5 + -1;
      if (bVar6) break;
      bVar3 = (*p->Stream->Read)(p->Stream);
      p->Code = (uint)bVar3 | UVar1 << 8;
    }
    uVar4 = (uint)(UVar1 != 0xffffffff);
  }
  return uVar4;
}

Assistant:

Bool Ppmd7z_RangeDec_Init(CPpmd7z_RangeDec *p)
{
  unsigned i;
  p->Code = 0;
  p->Range = 0xFFFFFFFF;
  if (p->Stream->Read((void *)p->Stream) != 0)
    return False;
  for (i = 0; i < 4; i++)
    p->Code = (p->Code << 8) | p->Stream->Read((void *)p->Stream);
  return (p->Code < 0xFFFFFFFF);
}